

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O0

bool __thiscall irr::gui::CGUIEditBox::OnEvent(CGUIEditBox *this,SEvent *event)

{
  bool bVar1;
  uint uVar2;
  SEvent *in_RSI;
  IGUIElement *in_RDI;
  SEvent *in_stack_00000030;
  s32 in_stack_00000038;
  s32 in_stack_0000003c;
  CGUIEditBox *in_stack_00000040;
  stringw *in_stack_00000198;
  CGUIEditBox *in_stack_000001a0;
  SEvent *in_stack_00000330;
  CGUIEditBox *in_stack_00000338;
  IGUIElement *this_00;
  
  this_00 = in_RDI;
  uVar2 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x12])();
  if ((uVar2 & 1) != 0) {
    switch(in_RSI->EventType) {
    case EET_GUI_EVENT:
      if (((in_RSI->field_1).GUIEvent.EventType == EGET_ELEMENT_FOCUS_LOST) &&
         ((in_RSI->field_1).GUIEvent.Caller == in_RDI)) {
        in_RDI->field_0x135 = 0;
        setTextMarkers(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
      }
      break;
    case EET_MOUSE_INPUT_EVENT:
      bVar1 = processMouse((CGUIEditBox *)CONCAT44(in_stack_0000003c,in_stack_00000038),
                           in_stack_00000030);
      if (bVar1) {
        return true;
      }
      break;
    case EET_KEY_INPUT_EVENT:
      bVar1 = processKey(in_stack_00000338,in_stack_00000330);
      if (bVar1) {
        return true;
      }
      break;
    case EET_STRING_INPUT_EVENT:
      inputString(in_stack_000001a0,in_stack_00000198);
      return true;
    }
  }
  bVar1 = IGUIElement::OnEvent(this_00,in_RSI);
  return bVar1;
}

Assistant:

bool CGUIEditBox::OnEvent(const SEvent &event)
{
	if (isEnabled()) {

		switch (event.EventType) {
		case EET_GUI_EVENT:
			if (event.GUIEvent.EventType == EGET_ELEMENT_FOCUS_LOST) {
				if (event.GUIEvent.Caller == this) {
					MouseMarking = false;
					setTextMarkers(0, 0);
				}
			}
			break;
		case EET_KEY_INPUT_EVENT:
			if (processKey(event))
				return true;
			break;
		case EET_MOUSE_INPUT_EVENT:
			if (processMouse(event))
				return true;
			break;
		case EET_STRING_INPUT_EVENT:
			inputString(*event.StringInput.Str);
			return true;
			break;
		default:
			break;
		}
	}

	return IGUIElement::OnEvent(event);
}